

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_andnot(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint8_t *puVar1;
  ushort uVar2;
  ushort uVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  long lVar6;
  uint8_t uVar7;
  uint uVar8;
  roaring_array_t *ra;
  roaring_bitmap_t *prVar9;
  int *c;
  int *piVar10;
  uint8_t uVar11;
  int iVar12;
  uint32_t uVar13;
  ulong uVar14;
  ulong uVar15;
  uint32_t uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint32_t end_index;
  uint32_t uVar21;
  uint32_t start_index;
  bool bVar22;
  uint8_t result_type;
  uint8_t local_49;
  uint32_t local_48;
  uint local_44;
  ulong local_40;
  int *local_38;
  
  local_49 = '\0';
  local_48 = (x1->high_low_container).size;
  if (local_48 == 0) {
    prVar9 = roaring_bitmap_create_with_capacity(0);
    if ((((x1->high_low_container).flags & 1) == 0) || (((x2->high_low_container).flags & 1) == 0))
    {
      puVar1 = &(prVar9->high_low_container).flags;
      *puVar1 = *puVar1 & 0xfe;
    }
    else {
      puVar1 = &(prVar9->high_low_container).flags;
      *puVar1 = *puVar1 | 1;
    }
    return prVar9;
  }
  local_44 = (x2->high_low_container).size;
  if (local_44 == 0) {
    prVar9 = roaring_bitmap_copy(x1);
    return prVar9;
  }
  ra = &roaring_bitmap_create_with_capacity(local_48)->high_low_container;
  if ((((x1->high_low_container).flags & 1) == 0) || (((x2->high_low_container).flags & 1) == 0)) {
    ra->flags = ra->flags & 0xfe;
  }
  else {
    ra->flags = ra->flags | 1;
  }
  uVar14 = 0;
  start_index = 0;
LAB_001182d8:
  do {
    uVar15 = uVar14 & 0xffff;
    local_40 = uVar14;
    while( true ) {
      puVar4 = (x1->high_low_container).keys;
      uVar18 = start_index & 0xffff;
      uVar2 = puVar4[uVar18];
      puVar5 = (x2->high_low_container).keys;
      uVar3 = puVar5[uVar15];
      if (uVar2 == uVar3) break;
      if (uVar3 <= uVar2) {
        uVar8 = (x2->high_low_container).size;
        uVar17 = (int)local_40 + 1;
        uVar18 = uVar17;
        if (((int)uVar8 <= (int)uVar17) || (uVar2 <= puVar5[(int)uVar17])) goto LAB_001184a3;
        uVar20 = (int)local_40 + 2;
        iVar19 = 1;
        if ((int)uVar8 <= (int)uVar20) goto LAB_0011848c;
        iVar19 = 1;
        goto LAB_00118473;
      }
      uVar21 = (x1->high_low_container).size;
      uVar13 = start_index + 1;
      end_index = uVar13;
      if (((int)uVar13 < (int)uVar21) && (puVar4[(int)uVar13] < uVar3)) {
        uVar16 = start_index + 2;
        iVar19 = 1;
        if ((int)uVar16 < (int)uVar21) {
          iVar12 = 1;
          do {
            iVar19 = iVar12;
            if (uVar3 <= puVar4[(int)uVar16]) goto LAB_00118357;
            iVar19 = iVar12 * 2;
            uVar16 = uVar13 + iVar12 * 2;
            iVar12 = iVar19;
          } while ((int)uVar16 < (int)uVar21);
        }
        uVar16 = uVar21 - 1;
LAB_00118357:
        end_index = uVar16;
        if (((puVar4[(int)uVar16] != uVar3) && (end_index = uVar21, uVar3 <= puVar4[(int)uVar16]))
           && (end_index = uVar16, (iVar19 >> 1) + uVar13 + 1 != uVar16)) {
          uVar13 = (iVar19 >> 1) + uVar13;
          do {
            end_index = (int)(uVar13 + uVar16) >> 1;
            if (puVar4[(int)end_index] == uVar3) break;
            uVar21 = end_index;
            if (puVar4[(int)end_index] < uVar3) {
              uVar21 = uVar16;
              uVar13 = end_index;
            }
            end_index = uVar21;
            uVar16 = uVar21;
          } while (uVar13 + 1 != uVar21);
        }
      }
      ra_append_copy_range
                (ra,&x1->high_low_container,start_index,end_index,
                 (_Bool)((x1->high_low_container).flags & 1));
      start_index = end_index;
      if (end_index == local_48) {
        uVar18 = (uint)local_40;
        goto LAB_00118598;
      }
    }
    c = (int *)container_andnot((x1->high_low_container).containers[uVar18],
                                (x1->high_low_container).typecodes[uVar18],
                                (x2->high_low_container).containers[uVar15],
                                (x2->high_low_container).typecodes[uVar15],&local_49);
    uVar7 = local_49;
    piVar10 = c;
    uVar11 = local_49;
    if (local_49 == '\x04') {
      uVar11 = (uint8_t)c[2];
      if (uVar11 == '\x04') {
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      piVar10 = *(int **)c;
    }
    if ((uVar11 == '\x03') || (uVar11 == '\x02')) {
      bVar22 = 0 < *piVar10;
    }
    else {
      if (uVar11 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x11c6,"_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
      }
      if (*piVar10 == -1) {
        if (**(long **)(piVar10 + 2) == 0) {
          uVar14 = 0xffffffffffffffff;
          do {
            if (uVar14 == 0x3fe) {
              uVar15 = 0x3ff;
              break;
            }
            uVar15 = uVar14 + 1;
            lVar6 = uVar14 + 2;
            uVar14 = uVar15;
          } while ((*(long **)(piVar10 + 2))[lVar6] == 0);
          bVar22 = 0x3fe < uVar15;
        }
        else {
          bVar22 = false;
        }
      }
      else {
        bVar22 = *piVar10 == 0;
      }
      bVar22 = (bool)(bVar22 ^ 1);
    }
    if (bVar22) {
      local_38 = c;
      extend_array(ra,1);
      iVar19 = ra->size;
      ra->keys[iVar19] = uVar2;
      ra->containers[iVar19] = local_38;
      ra->typecodes[iVar19] = uVar7;
      ra->size = ra->size + 1;
    }
    else {
      container_free(c,local_49);
    }
    start_index = start_index + 1;
    uVar18 = (int)local_40 + 1;
    uVar14 = (ulong)uVar18;
  } while ((start_index != local_48) && (uVar18 != local_44));
  goto LAB_00118598;
  while( true ) {
    iVar12 = iVar19 * 2;
    uVar20 = uVar17 + iVar19 * 2;
    iVar19 = iVar12;
    if ((int)uVar8 <= (int)uVar20) break;
LAB_00118473:
    if (uVar2 <= puVar5[(int)uVar20]) goto LAB_00118492;
  }
LAB_0011848c:
  uVar20 = uVar8 - 1;
LAB_00118492:
  uVar18 = uVar20;
  if (((puVar5[(int)uVar20] != uVar2) && (uVar18 = uVar8, uVar2 <= puVar5[(int)uVar20])) &&
     (uVar18 = uVar20, (iVar19 >> 1) + uVar17 + 1 != uVar20)) {
    uVar17 = (iVar19 >> 1) + uVar17;
    do {
      uVar18 = (int)(uVar17 + uVar20) >> 1;
      if (puVar5[(int)uVar18] == uVar2) break;
      uVar8 = uVar18;
      if (puVar5[(int)uVar18] < uVar2) {
        uVar8 = uVar20;
        uVar17 = uVar18;
      }
      uVar18 = uVar8;
      uVar20 = uVar8;
    } while (uVar17 + 1 != uVar8);
  }
LAB_001184a3:
  uVar14 = (ulong)uVar18;
  if (uVar18 == local_44) {
LAB_00118598:
    if (uVar18 != local_44) {
      return (roaring_bitmap_t *)ra;
    }
    ra_append_copy_range
              (ra,&x1->high_low_container,start_index,local_48,
               (_Bool)((x1->high_low_container).flags & 1));
    return (roaring_bitmap_t *)ra;
  }
  goto LAB_001182d8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_andnot(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        roaring_bitmap_t *empty_bitmap = roaring_bitmap_create();
        roaring_bitmap_set_copy_on_write(empty_bitmap, is_cow(x1) && is_cow(x2));
        return empty_bitmap;
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(length1);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = 0;
    uint16_t s2 = 0;
    while (true) {
        s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_andnot(c1, type1, c2, type2,
                                              &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
        } else if (s1 < s2) {  // s1 < s2
            const int next_pos1 =
                ra_advance_until(&x1->high_low_container, s2, pos1);
            ra_append_copy_range(&answer->high_low_container,
                                 &x1->high_low_container, pos1, next_pos1,
                                 is_cow(x1));
            // TODO : perhaps some of the copy_on_write should be based on
            // answer rather than x1 (more stringent?).  Many similar cases
            pos1 = next_pos1;
            if (pos1 == length1) break;
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
        }
    }
    if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}